

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O0

void __thiscall tf::Graph::_clear_detached(Graph *this)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  __normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_> __last;
  reference ppNVar4;
  size_type __new_size;
  __normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_> local_40;
  __normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_> local_38;
  __normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_> itr;
  __normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_> mid;
  Graph *this_local;
  
  iVar2 = std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>::begin(&this->_nodes);
  iVar3 = std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>::end(&this->_nodes);
  __last = std::
           partition<__gnu_cxx::__normal_iterator<tf::Node**,std::vector<tf::Node*,std::allocator<tf::Node*>>>,tf::Graph::_clear_detached()::_lambda(tf::Node*)_1_>
                     (iVar2._M_current,iVar3._M_current);
  local_38 = __last;
  while( true ) {
    local_40._M_current =
         (Node **)std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>::end(&this->_nodes);
    bVar1 = __gnu_cxx::
            operator==<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_>
                      (&local_38,&local_40);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppNVar4 = __gnu_cxx::
              __normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_>
              ::operator*(&local_38);
    ObjectPool<tf::Node,_65536UL>::recycle((ObjectPool<tf::Node,_65536UL> *)node_pool,*ppNVar4);
    __gnu_cxx::__normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_>
    ::operator++(&local_38);
  }
  iVar2 = std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>::begin(&this->_nodes);
  __new_size = std::
               distance<__gnu_cxx::__normal_iterator<tf::Node**,std::vector<tf::Node*,std::allocator<tf::Node*>>>>
                         ((__normal_iterator<tf::Node_**,_std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>_>
                           )iVar2._M_current,__last);
  std::vector<tf::Node_*,_std::allocator<tf::Node_*>_>::resize(&this->_nodes,__new_size);
  return;
}

Assistant:

inline void Graph::_clear_detached() {

  auto mid = std::partition(_nodes.begin(), _nodes.end(), [] (Node* node) {
    return !(node->_state.load(std::memory_order_relaxed) & Node::DETACHED);
  });

  for(auto itr = mid; itr != _nodes.end(); ++itr) {
    node_pool.recycle(*itr);
  }
  _nodes.resize(std::distance(_nodes.begin(), mid));
}